

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::SurfaceAttribPbufferCase::executeForConfig
          (SurfaceAttribPbufferCase *this,EGLDisplay display,EGLConfig config)

{
  deInt32 a;
  deUint32 dVar1;
  EGLint EVar2;
  int iVar3;
  Library *egl_00;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  undefined4 extraout_var;
  EGLSurface surface_00;
  undefined1 local_420 [8];
  UniqueSurface surface;
  EGLint attribs [7];
  MessageBuilder local_3e0;
  MessageBuilder local_250;
  undefined1 local_d0 [8];
  ConfigInfo info;
  int height;
  int width;
  TestLog *log;
  Library *egl;
  EGLConfig config_local;
  EGLDisplay display_local;
  SurfaceAttribPbufferCase *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                      m_eglTestCtx);
  this_00 = tcu::TestContext::getLog
                      ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  info.colorComponentType = 0x40;
  info.yuvPlaneBpp = 0x40;
  eglu::ConfigInfo::ConfigInfo((ConfigInfo *)local_d0);
  eglu::queryCoreConfigInfo(egl_00,display,config,(ConfigInfo *)local_d0);
  tcu::TestLog::operator<<(&local_250,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_250,(char (*) [41])"Creating pbuffer surface with config ID ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&info.colorBufferType);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_250);
  dVar1 = (*egl_00->_vptr_Library[0x1f])();
  eglu::checkError(dVar1,"before queries",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQuerySurfaceTests.cpp"
                   ,0x285);
  dVar1 = info.colorComponentType;
  EVar2 = eglu::getConfigAttribInt(egl_00,display,config,0x302c);
  info.colorComponentType = deMin32(dVar1,EVar2);
  a = info.yuvPlaneBpp;
  EVar2 = eglu::getConfigAttribInt(egl_00,display,config,0x302a);
  info.yuvPlaneBpp = deMin32(a,EVar2);
  if ((info.colorComponentType == 0) || (info.yuvPlaneBpp == 0)) {
    tcu::TestLog::operator<<(&local_3e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_3e0,(char (*) [35])"    Fail, maximum pbuffer size of ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&info.colorComponentType);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x5b3da7);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&info.yuvPlaneBpp);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [10])" reported");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3e0);
    tcu::TestContext::setTestResult
              ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid maximum pbuffer size");
  }
  else {
    surface.m_surface._0_4_ = 0x3057;
    surface.m_surface._4_4_ = info.colorComponentType;
    iVar3 = (*egl_00->_vptr_Library[10])(egl_00,display,config,&surface.m_surface);
    eglu::UniqueSurface::UniqueSurface
              ((UniqueSurface *)local_420,egl_00,display,(EGLSurface)CONCAT44(extraout_var,iVar3));
    surface_00 = eglu::UniqueSurface::operator*((UniqueSurface *)local_420);
    SurfaceAttribCase::testAttributes
              (&this->super_SurfaceAttribCase,display,surface_00,1,(ConfigInfo *)local_d0);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_420);
  }
  return;
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		tcu::TestLog&	log		= m_testCtx.getLog();
		int				width	= 64;
		int				height	= 64;
		ConfigInfo		info;

		eglu::queryCoreConfigInfo(egl, display, config, &info);

		log << TestLog::Message << "Creating pbuffer surface with config ID " << info.configId << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "before queries");

		// Clamp to maximums reported by implementation
		width	= deMin32(width, eglu::getConfigAttribInt(egl, display, config, EGL_MAX_PBUFFER_WIDTH));
		height	= deMin32(height, eglu::getConfigAttribInt(egl, display, config, EGL_MAX_PBUFFER_HEIGHT));

		if (width == 0 || height == 0)
		{
			log << TestLog::Message << "    Fail, maximum pbuffer size of " << width << "x" << height << " reported" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid maximum pbuffer size");
			return;
		}

		const EGLint attribs[] =
		{
			EGL_WIDTH,			width,
			EGL_HEIGHT,			height,
			EGL_TEXTURE_FORMAT,	EGL_NO_TEXTURE,
			EGL_NONE
		};

		eglu::UniqueSurface surface(egl, display, egl.createPbufferSurface(display, config, attribs));

		testAttributes(display, *surface, EGL_PBUFFER_BIT, info);
	}